

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

void __thiscall
acto::actor::fun_handler_t<A::M,_acto::actor_ref,_const_A::M_&>::invoke
          (fun_handler_t<A::M,_acto::actor_ref,_const_A::M_&> *this,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  pointer pmVar1;
  M *__args_1;
  actor_ref local_20;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *local_18;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg_local;
  fun_handler_t<A::M,_acto::actor_ref,_const_A::M_&> *this_local;
  
  local_18 = msg;
  msg_local = (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)this;
  pmVar1 = std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::operator->
                     (msg);
  actor_ref::actor_ref(&local_20,pmVar1->sender,true);
  pmVar1 = std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::get(msg);
  __args_1 = core::message_container<A::M,_true>::data((message_container<A::M,_true> *)pmVar1);
  std::function<void_(acto::actor_ref,_const_A::M_&)>::operator()(&this->func_,&local_20,__args_1);
  actor_ref::~actor_ref(&local_20);
  return;
}

Assistant:

void invoke(std::unique_ptr<core::msg_t> msg) const final {
      if constexpr (sizeof...(Args) == 0) {
        func_();
      } else if constexpr (sizeof...(Args) == 1) {
        using P0 = std::tuple_element_t<0, std::tuple<Args...>>;

        if constexpr (std::is_same_v<actor_ref, std::decay_t<P0>>) {
          func_(actor_ref(msg->sender, true));
        } else {
          func_(static_cast<message_reference_t<M, P0>>(*msg.get()).data());
        }
      } else if constexpr (sizeof...(Args) == 2) {
        using P1 = std::tuple_element_t<1, std::tuple<Args...>>;

        func_(actor_ref(msg->sender, true),
              static_cast<message_reference_t<M, P1>>(*msg.get()).data());
      }
    }